

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O3

bool __thiscall
cfd::AddressFactory::CheckAddressNetType(AddressFactory *this,Address *address,NetType net_type)

{
  AddressType AVar1;
  pointer pAVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  NetType NVar5;
  int iVar6;
  pointer this_00;
  bool bVar7;
  AddressFormatData addr_format;
  string local_98;
  string local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  bVar7 = true;
  if (address->type_ != net_type) {
    AVar1 = address->addr_type_;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_58,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&address->format_data_);
    pAVar2 = (this->prefix_list_).
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->prefix_list_).
                   super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pAVar2;
        this_00 = this_00 + 1) {
      NVar5 = core::AddressFormatData::GetNetType(this_00);
      if (NVar5 == net_type) {
        bVar7 = false;
        if (kWitnessUnknown < AVar1) goto LAB_003a9077;
        if ((0x198U >> (AVar1 & 0x1f) & 1) == 0) {
          if ((0x62U >> (AVar1 & 0x1f) & 1) == 0) {
            bVar7 = false;
            if (AVar1 != kP2pkhAddress) goto LAB_003a9077;
            uVar3 = core::AddressFormatData::GetP2pkhPrefix(this_00);
            uVar4 = core::AddressFormatData::GetP2pkhPrefix((AddressFormatData *)&local_58);
          }
          else {
            uVar3 = core::AddressFormatData::GetP2shPrefix(this_00);
            uVar4 = core::AddressFormatData::GetP2shPrefix((AddressFormatData *)&local_58);
          }
          bVar7 = uVar3 == uVar4;
        }
        else {
          core::AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_78,this_00);
          core::AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_98,(AddressFormatData *)&local_58)
          ;
          if (local_78._M_string_length == local_98._M_string_length) {
            if (local_78._M_string_length == 0) {
              bVar7 = true;
            }
            else {
              iVar6 = bcmp(local_78._M_dataplus._M_p,local_98._M_dataplus._M_p,
                           local_78._M_string_length);
              bVar7 = iVar6 == 0;
            }
          }
          else {
            bVar7 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
        }
        goto LAB_003a9077;
      }
    }
    bVar7 = false;
LAB_003a9077:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_58);
  }
  return bVar7;
}

Assistant:

bool AddressFactory::CheckAddressNetType(
    const Address& address, NetType net_type) const {
  if (address.GetNetType() == net_type) {
    return true;
  }

  // check prefix
  bool result = false;
  AddressType addr_type = address.GetAddressType();
  AddressFormatData addr_format = address.GetAddressFormatData();
  for (auto& prefix : prefix_list_) {
    if (prefix.GetNetType() == net_type) {
      switch (addr_type) {
        case AddressType::kP2pkhAddress:
          result = (prefix.GetP2pkhPrefix() == addr_format.GetP2pkhPrefix());
          break;
        case AddressType::kP2shP2wpkhAddress:
          // fall-through
        case AddressType::kP2shP2wshAddress:
          // fall-through
        case AddressType::kP2shAddress:
          result = (prefix.GetP2shPrefix() == addr_format.GetP2shPrefix());
          break;
        case AddressType::kP2wpkhAddress:
          // fall-through
        case AddressType::kP2wshAddress:
          // fall-through
        case AddressType::kTaprootAddress:
          // fall-through
        case AddressType::kWitnessUnknown:
          result = (prefix.GetBech32Hrp() == addr_format.GetBech32Hrp());
          break;
        default:
          result = false;
          break;
      }
      break;
    }
  }

  return result;
}